

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::FillWheatsheafItems
          (aggreports *this,outkey2 key,
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,OASIS_FLOAT loss,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *maxPeriodNo,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting)

{
  iterator __position;
  _Base_ptr p_Var1;
  mapped_type_conflict1 *pmVar2;
  vector<lossval,std::allocator<lossval>> *this_00;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  int iVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_double>_>,_std::_Rb_tree_iterator<std::pair<const_int,_double>_>_>
  pVar6;
  wheatkey wk;
  lossval lv;
  undefined8 local_50;
  int local_48;
  key_type local_40;
  lossval local_38;
  
  local_48 = key.sidx;
  local_50 = key._0_8_;
  local_40.summary_id = key.summary_id;
  p_Var1 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_40.sidx = local_48;
  local_38.value = loss;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var4 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var4->_M_header;
    do {
      iVar5 = key.period_no;
      if (iVar5 <= (int)p_Var1[1]._M_color) {
        p_Var3 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < iVar5];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var4) && ((int)p_Var3[1]._M_color <= iVar5)) {
      local_38.period_weighting = (double)p_Var3[1]._M_parent;
      local_38.period_no = iVar5;
      pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](maxPeriodNo,(key_type *)&local_50);
      if (*pmVar2 < iVar5) {
        pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](maxPeriodNo,(key_type *)&local_50);
        *pmVar2 = iVar5;
      }
      this_00 = (vector<lossval,std::allocator<lossval>> *)
                std::
                map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                ::operator[](items,&local_40);
      __position._M_current = *(lossval **)(this_00 + 8);
      if (__position._M_current == *(lossval **)(this_00 + 0x10)) {
        std::vector<lossval,std::allocator<lossval>>::_M_realloc_insert<lossval_const&>
                  (this_00,__position,&local_38);
      }
      else {
        *(ulong *)&(__position._M_current)->value = CONCAT44(local_38._20_4_,local_38.value);
        *(ulong *)__position._M_current = CONCAT44(local_38._4_4_,local_38.period_no);
        (__position._M_current)->period_weighting = local_38.period_weighting;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x18;
      }
    }
  }
  pVar6 = std::
          _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::equal_range(&unusedperiodstoweighting->_M_t,(key_type *)((long)&local_50 + 4));
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_M_erase_aux(&unusedperiodstoweighting->_M_t,(_Base_ptr)pVar6.first._M_node,
                 (_Base_ptr)pVar6.second._M_node);
  return;
}

Assistant:

inline void aggreports::FillWheatsheafItems(const outkey2 key,
	std::map<wheatkey, lossvec2> &items, const OASIS_FLOAT loss,
	std::map<int, int> &maxPeriodNo,
	std::map<int, double> &unusedperiodstoweighting) {

  wheatkey wk;
  wk.sidx = key.sidx;
  wk.summary_id = key.summary_id;
  lossval lv;
  lv.value = loss;
  auto iter = periodstoweighting_.find(key.period_no);
  if (iter != periodstoweighting_.end()) {
    lv.period_weighting = iter->second;
    lv.period_no = key.period_no;
    if (lv.period_no > maxPeriodNo[key.summary_id]) {
	maxPeriodNo[key.summary_id] = lv.period_no;
    }
    items[wk].push_back(lv);
  }
  unusedperiodstoweighting.erase(key.period_no);

}